

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O3

double json_object_get_double(json_object *jso)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  json_object_to_json_string_fn **__nptr;
  json_object_to_json_string_fn **ppjVar4;
  double dVar5;
  char *errPtr;
  json_object_to_json_string_fn *local_28;
  
  local_28 = (json_object_to_json_string_fn *)0x0;
  if (jso == (json_object *)0x0) {
    return 0.0;
  }
  switch(jso->o_type) {
  case json_type_boolean:
    dVar5 = (double)(int)jso[1].o_type;
    break;
  case json_type_double:
    dVar5 = *(double *)(jso + 1);
    break;
  case json_type_int:
    if (jso[1].o_type == json_type_boolean) {
      dVar5 = ((double)CONCAT44(0x45300000,(int)((ulong)jso[1]._to_json_string >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)jso[1]._to_json_string) - 4503599627370496.0);
    }
    else {
      if (jso[1].o_type != json_type_null) {
        json_object_get_double_cold_1();
      }
      dVar5 = (double)(long)jso[1]._to_json_string;
    }
    break;
  default:
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    goto LAB_00105f7f;
  case json_type_string:
    piVar3 = __errno_location();
    *piVar3 = 0;
    ppjVar4 = &jso[1]._to_json_string;
    lVar1._0_4_ = jso[1].o_type;
    lVar1._4_4_ = jso[1]._ref_count;
    __nptr = ppjVar4;
    if (lVar1 < 0) {
      __nptr = (json_object_to_json_string_fn **)*ppjVar4;
    }
    dVar5 = strtod((char *)__nptr,(char **)&local_28);
    lVar2._0_4_ = jso[1].o_type;
    lVar2._4_4_ = jso[1]._ref_count;
    if (lVar2 < 0) {
      ppjVar4 = (json_object_to_json_string_fn **)*ppjVar4;
    }
    if (((json_object_to_json_string_fn **)local_28 == ppjVar4) ||
       (*local_28 != (json_object_to_json_string_fn)0x0)) {
      *piVar3 = 0x16;
    }
    else {
      if (ABS(dVar5) != INFINITY) {
        return dVar5;
      }
      if (*piVar3 != 0x22) {
        return dVar5;
      }
    }
LAB_00105f7f:
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

double json_object_get_double(const struct json_object *jso)
{
	double cdouble;
	char *errPtr = NULL;

	if (!jso)
		return 0.0;
	switch (jso->o_type)
	{
	case json_type_double: return JC_DOUBLE_C(jso)->c_double;
	case json_type_int:
		switch (JC_INT_C(jso)->cint_type)
		{
		case json_object_int_type_int64: return JC_INT_C(jso)->cint.c_int64;
		case json_object_int_type_uint64: return JC_INT_C(jso)->cint.c_uint64;
		default: json_abort("invalid cint_type");
		}
	case json_type_boolean: return JC_BOOL_C(jso)->c_boolean;
	case json_type_string:
		errno = 0;
		cdouble = strtod(get_string_component(jso), &errPtr);

		/* if conversion stopped at the first character, return 0.0 */
		if (errPtr == get_string_component(jso))
		{
			errno = EINVAL;
			return 0.0;
		}

		/*
		 * Check that the conversion terminated on something sensible
		 *
		 * For example, { "pay" : 123AB } would parse as 123.
		 */
		if (*errPtr != '\0')
		{
			errno = EINVAL;
			return 0.0;
		}

		/*
		 * If strtod encounters a string which would exceed the
		 * capacity of a double, it returns +/- HUGE_VAL and sets
		 * errno to ERANGE. But +/- HUGE_VAL is also a valid result
		 * from a conversion, so we need to check errno.
		 *
		 * Underflow also sets errno to ERANGE, but it returns 0 in
		 * that case, which is what we will return anyway.
		 *
		 * See CERT guideline ERR30-C
		 */
		if ((HUGE_VAL == cdouble || -HUGE_VAL == cdouble) && (ERANGE == errno))
			cdouble = 0.0;
		return cdouble;
	default: errno = EINVAL; return 0.0;
	}
}